

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.c
# Opt level: O0

void vrna_md_defaults_backtrack_type(char t)

{
  char cVar1;
  char cVar2;
  char t_local;
  
  cVar1 = t;
  cVar2 = t;
  if (((t != 'C') && (cVar1 = t, cVar2 = t, t != 'F')) && (cVar1 = t, cVar2 = t, t != 'M')) {
    vrna_message_warning
              (
              "vrna_md_defaults_backtrack_type@model.c: Backtrack type must be any of \'F\', \'C\', or \'M\'. Not changing anything!"
              );
    cVar1 = backtrack_type;
    cVar2 = defaults.backtrack_type;
  }
  defaults.backtrack_type = cVar2;
  backtrack_type = cVar1;
  return;
}

Assistant:

PUBLIC void
vrna_md_defaults_backtrack_type(char t)
{
  switch (t) {
    case 'M': /* fall through */
    case 'C': /* fall through */
    case 'F':
      defaults.backtrack_type = t;
#ifndef VRNA_DISABLE_BACKWARD_COMPATIBILITY
      backtrack_type = t;
#endif
      break;
    default:
      vrna_message_warning(
        "vrna_md_defaults_backtrack_type@model.c: Backtrack type must be any of 'F', 'C', or 'M'. Not changing anything!");
  }
}